

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

Box * __thiscall amrex::FabArrayBase::fabbox(FabArrayBase *this,int K)

{
  long in_RSI;
  BoxArray *in_RDI;
  BoxArray *pBVar1;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  int local_20;
  IntVect *local_10;
  undefined8 *local_8;
  
  pBVar1 = in_RDI;
  BoxArray::operator[](in_RDI,(int)((ulong)in_RDI >> 0x20));
  local_10 = (IntVect *)(in_RSI + 0xc0);
  local_8 = &local_38;
  *(undefined8 *)&in_RDI->m_bat = local_38;
  *(undefined8 *)((long)&(in_RDI->m_bat).m_op + 4) = local_30;
  *(undefined8 *)((long)&(in_RDI->m_bat).m_op + 0xc) = local_28;
  (in_RDI->m_bat).m_op.m_bndryReg.m_loshft.vect[0] = local_20;
  Box::grow((Box *)in_RDI,local_10);
  return (Box *)pBVar1;
}

Assistant:

Box
FabArrayBase::fabbox (int K) const noexcept
{
    return amrex::grow(boxarray[K], n_grow);
}